

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

void __thiscall Shader::Shader(Shader *this,GLchar *vertexPath,GLchar *fragmentPath)

{
  undefined4 uVar1;
  char cVar2;
  GLuint GVar3;
  GLuint GVar4;
  istream *piVar5;
  istream *piVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  char local_6e8 [8];
  GLchar infoLog [512];
  ifstream VertexShaderStream;
  undefined1 local_2e0 [8];
  ifstream FragmentShaderStream;
  char local_2d0 [504];
  size_type *local_d8;
  string VertexShaderCode;
  undefined1 local_a8 [16];
  size_type *local_98;
  GLchar *VertexSourcePointer;
  _Alloc_hider local_88;
  GLchar *FragmentSourcePointer;
  undefined1 local_68 [8];
  string FragmentShaderCode;
  int local_34 [2];
  GLint success;
  
  local_d8 = &VertexShaderCode._M_string_length;
  VertexShaderCode._M_dataplus._M_p = (pointer)0x0;
  VertexShaderCode._M_string_length._0_1_ = 0;
  piVar6 = (istream *)(infoLog + 0x1f8);
  VertexSourcePointer = fragmentPath;
  std::ifstream::ifstream(piVar6,vertexPath,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_2e0 = (undefined1  [8])local_2d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"");
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(infoLog._504_8_ + -0x18) + (char)piVar6);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (piVar6,(string *)local_2e0,cVar2);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "\n",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2e0);
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_68);
      if (local_68 != (undefined1  [8])&FragmentShaderCode._M_string_length) {
        operator_delete((void *)local_68);
      }
    }
    std::ifstream::close();
    if (local_2e0 != (undefined1  [8])local_2d0) {
      operator_delete((void *)local_2e0);
    }
  }
  local_98 = local_d8;
  GVar3 = (*__glewCreateShader)(0x8b31);
  (*__glewShaderSource)(GVar3,1,(GLchar **)&local_98,(GLint *)0x0);
  (*__glewCompileShader)(GVar3);
  (*__glewGetShaderiv)(GVar3,0x8b81,local_34);
  if (local_34[0] == 0) {
    pcVar9 = local_6e8;
    (*__glewGetShaderInfoLog)(GVar3,0x200,(GLsizei *)0x0,pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR::SHADER::VERTEX::COMPILATION_FAILED\n",0x2a);
    sVar7 = strlen(pcVar9);
  }
  else {
    sVar7 = 0x16;
    pcVar9 = "loaded: \'vertexShader\'";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  local_68 = (undefined1  [8])&FragmentShaderCode._M_string_length;
  FragmentShaderCode._M_dataplus._M_p = (pointer)0x0;
  FragmentShaderCode._M_string_length._0_1_ = 0;
  FragmentShaderCode.field_2._12_4_ = GVar3;
  std::ifstream::ifstream((istream *)local_2e0,VertexSourcePointer,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_88._M_p = &stack0xffffffffffffff88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff78,"");
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)((long)local_2e0 + -0x18) +
                              (char)(istream *)local_2e0);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_2e0,(string *)&stack0xffffffffffffff78,cVar2);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&VertexShaderCode.field_2 + 8),"\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff78);
      std::__cxx11::string::_M_append(local_68,VertexShaderCode.field_2._8_8_);
      if ((undefined1 *)VertexShaderCode.field_2._8_8_ != local_a8) {
        operator_delete((void *)VertexShaderCode.field_2._8_8_);
      }
    }
    std::ifstream::close();
    if (local_88._M_p != &stack0xffffffffffffff88) {
      operator_delete(local_88._M_p);
    }
  }
  local_88._M_p = (pointer)local_68;
  GVar3 = (*__glewCreateShader)(0x8b30);
  uVar1 = FragmentShaderCode.field_2._12_4_;
  (*__glewShaderSource)(GVar3,1,&stack0xffffffffffffff78._M_p,(GLint *)0x0);
  (*__glewCompileShader)(GVar3);
  (*__glewGetShaderiv)(GVar3,0x8b81,local_34);
  if (local_34[0] == 0) {
    pcVar9 = local_6e8;
    (*__glewGetShaderInfoLog)(GVar3,0x200,(GLsizei *)0x0,pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR::SHADER::FRAGMENT::COMPILATION_FAILED\n",0x2c);
    sVar7 = strlen(pcVar9);
  }
  else {
    sVar7 = 0x18;
    pcVar9 = "loaded: \'fragmentShader\'";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  GVar4 = (*__glewCreateProgram)();
  this->Program = GVar4;
  (*__glewAttachShader)(GVar4,uVar1);
  (*__glewAttachShader)(this->Program,GVar3);
  (*__glewLinkProgram)(this->Program);
  (*__glewGetProgramiv)(this->Program,0x8b82,local_34);
  if (local_34[0] == 0) {
    (*__glewGetProgramInfoLog)(this->Program,0x200,(GLsizei *)0x0,local_6e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR::SHADER::PROGRAM::COMPILATION_FAILED [",0x2c);
    sVar7 = strlen(local_6e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_6e8,sVar7);
    lVar8 = 1;
    pcVar9 = "]";
  }
  else {
    lVar8 = 0x17;
    pcVar9 = "loaded: \'shaderProgram\'";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  (*__glewDeleteShader)(uVar1);
  (*__glewDeleteShader)(GVar3);
  std::ifstream::~ifstream(local_2e0);
  if (local_68 != (undefined1  [8])&FragmentShaderCode._M_string_length) {
    operator_delete((void *)local_68);
  }
  std::ifstream::~ifstream(infoLog + 0x1f8);
  if (local_d8 != &VertexShaderCode._M_string_length) {
    operator_delete(local_d8);
  }
  return;
}

Assistant:

Shader::Shader(const GLchar* vertexPath, const GLchar* fragmentPath) {
	// error info
	GLint success;
	GLchar infoLog[512];

	// get vertex shader code
	std::string VertexShaderCode;
	std::ifstream VertexShaderStream(vertexPath, std::ios::in);
	if (VertexShaderStream.is_open()) {
		std::string Line = "";
		while (getline(VertexShaderStream, Line)) {
			VertexShaderCode += "\n" + Line;
		}
		VertexShaderStream.close();
	}
	const GLchar* VertexSourcePointer = VertexShaderCode.c_str();

	// set vertexshader
	GLuint vertexShader;
	vertexShader = glCreateShader(GL_VERTEX_SHADER);

	glShaderSource(vertexShader, 1, &VertexSourcePointer, NULL);
	glCompileShader(vertexShader);

	glGetShaderiv(vertexShader, GL_COMPILE_STATUS, &success);

	if (!success) {
		glGetShaderInfoLog(vertexShader, 512, NULL, infoLog);
		std::cout << "ERROR::SHADER::VERTEX::COMPILATION_FAILED\n" << infoLog << std::endl;
	}
	else {
		std::cout << "loaded: 'vertexShader'" << std::endl;
	}

	// get fragment shader code
	std::string FragmentShaderCode;
	std::ifstream FragmentShaderStream(fragmentPath, std::ios::in);
	if (FragmentShaderStream.is_open()) {
		std::string Line = "";
		while (getline(FragmentShaderStream, Line)) {
			FragmentShaderCode += "\n" + Line;
		}
		FragmentShaderStream.close();
	}
	const GLchar* FragmentSourcePointer = FragmentShaderCode.c_str();

	// set fragmentshader
	GLuint fragmentShader;
	fragmentShader = glCreateShader(GL_FRAGMENT_SHADER);

	glShaderSource(fragmentShader, 1, &FragmentSourcePointer, NULL);
	glCompileShader(fragmentShader);

	glGetShaderiv(fragmentShader, GL_COMPILE_STATUS, &success);
	if (!success) {
		glGetShaderInfoLog(fragmentShader, 512, NULL, infoLog);
		std::cout << "ERROR::SHADER::FRAGMENT::COMPILATION_FAILED\n" << infoLog << std::endl;
	}
	else {
		std::cout << "loaded: 'fragmentShader'" << std::endl;
	}

	// set shader program
	this->Program = glCreateProgram();

	glAttachShader(this->Program, vertexShader);
	glAttachShader(this->Program, fragmentShader);
	glLinkProgram(this->Program);

	// load program
	glGetProgramiv(this->Program, GL_LINK_STATUS, &success);
	if (!success) {
		glGetProgramInfoLog(this->Program, 512, NULL, infoLog);
		std::cout << "ERROR::SHADER::PROGRAM::COMPILATION_FAILED [" << infoLog << "]" << std::endl;
	}
	else {
		std::cout << "loaded: 'shaderProgram'" << std::endl;
	}

	// delete shaders
	glDeleteShader(vertexShader);
	glDeleteShader(fragmentShader);
}